

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O0

void __thiscall ManchesterAnalyzer::SynchronizeBiPhase(ManchesterAnalyzer *this)

{
  long lVar1;
  ulong uVar2;
  element_type *peVar3;
  size_type sVar4;
  reference pvVar5;
  iterator __first;
  iterator __last;
  uint local_70;
  U32 i;
  U32 count;
  undefined1 local_48 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> locations_to_save;
  U32 bit_value;
  U64 edge_distance;
  U64 next_edge_location;
  U64 edge_location;
  ManchesterAnalyzer *this_local;
  
  edge_location = (U64)this;
  while( true ) {
    while( true ) {
      if ((this->mSynchronized & 1U) != 0) {
        return;
      }
      Analyzer::CheckIfThreadShouldExit();
      next_edge_location = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      lVar1 = AnalyzerChannelData::GetSampleNumber();
      uVar2 = lVar1 - next_edge_location;
      if ((uVar2 <= this->mT - this->mTError) || (this->mT + this->mTError <= uVar2)) break;
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mUnsyncedLocations,&next_edge_location);
    }
    if ((this->mT * 2 - this->mTError < uVar2) && (uVar2 < this->mT * 2 + this->mTError)) break;
    Invalidate(this);
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
            (&this->mUnsyncedLocations,&next_edge_location);
  this->mSynchronized = true;
  locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  peVar3 = std::auto_ptr<ManchesterAnalyzerSettings>::operator->(&this->mSettings);
  if (peVar3->mMode == BI_PHASE_MARK) {
    locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    peVar3 = std::auto_ptr<ManchesterAnalyzerSettings>::operator->(&this->mSettings);
    if (peVar3->mMode == BI_PHASE_SPACE) {
      locations_to_save.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48);
  while (sVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                           (&this->mUnsyncedLocations), sVar4 != 0) {
    pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::back
                       (&this->mUnsyncedLocations);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48,pvVar5);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::pop_back
              (&this->mUnsyncedLocations);
    sVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                      (&this->mUnsyncedLocations);
    if (sVar4 != 0) {
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::pop_back
                (&this->mUnsyncedLocations);
    }
  }
  __first = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::begin
                      ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48);
  __last = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::end
                     ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>>
            ((__normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
              )__last._M_current);
  sVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                    ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48);
  for (local_70 = 0; local_70 < (uint)sVar4; local_70 = local_70 + 1) {
    if (local_70 == (uint)sVar4 - 1) {
      pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_48,(ulong)local_70);
      SaveBit(this,*pvVar5,
              locations_to_save.
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ ^ 1);
    }
    else {
      pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_48,(ulong)local_70);
      SaveBit(this,*pvVar5,
              locations_to_save.
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_);
    }
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_48);
  return;
}

Assistant:

void ManchesterAnalyzer::SynchronizeBiPhase()
{
    while( mSynchronized == false )
    {
        CheckIfThreadShouldExit();
        U64 edge_location = mManchester->GetSampleNumber();
        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            mUnsyncedLocations.push_back( edge_location );
        }
        else if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            mUnsyncedLocations.push_back( edge_location );
            mSynchronized = true;
            U32 bit_value = 0;
            if( mSettings->mMode == BI_PHASE_MARK ) // FM1
                bit_value = 1;
            else if( mSettings->mMode == BI_PHASE_SPACE ) // FM0
                bit_value = 0;

            std::vector<U64> locations_to_save;
            while( mUnsyncedLocations.size() > 0 )
            {
                locations_to_save.push_back( mUnsyncedLocations.back() );
                mUnsyncedLocations.pop_back();
                if( mUnsyncedLocations.size() > 0 )
                    mUnsyncedLocations.pop_back();
            }
            std::sort( locations_to_save.begin(), locations_to_save.end() );
            U32 count = locations_to_save.size();
            for( U32 i = 0; i < count; ++i )
            {
                if( i == ( count - 1 ) )
                    SaveBit( locations_to_save[ i ], bit_value ^ 0x1 );
                else
                    SaveBit( locations_to_save[ i ], bit_value );
            }
            break;
        }
        else
        {
            // back to idle.
            Invalidate();
        }
    }
}